

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::MasteringMetadata::PayloadSize(MasteringMetadata *this)

{
  uint64 uVar1;
  uint64_t uVar2;
  float *in_RDI;
  PrimaryChromaticity *unaff_retaddr;
  uint64_t size;
  uint64_t type;
  float *pfVar3;
  
  type = 0;
  pfVar3 = in_RDI;
  if ((*in_RDI != 3.4028235e+38) || (NAN(*in_RDI))) {
    uVar1 = EbmlElementSize(0,(float)((ulong)in_RDI >> 0x20));
    type = uVar1 + type;
  }
  if ((in_RDI[1] != 3.4028235e+38) || (NAN(in_RDI[1]))) {
    uVar1 = EbmlElementSize(type,(float)((ulong)in_RDI >> 0x20));
    type = uVar1 + type;
  }
  if (*(long *)(in_RDI + 2) != 0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (unaff_retaddr,(MkvId)((ulong)pfVar3 >> 0x20),(MkvId)pfVar3);
    type = uVar2 + type;
  }
  if (*(long *)(in_RDI + 4) != 0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (unaff_retaddr,(MkvId)((ulong)pfVar3 >> 0x20),(MkvId)pfVar3);
    type = uVar2 + type;
  }
  if (*(long *)(in_RDI + 6) != 0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (unaff_retaddr,(MkvId)((ulong)pfVar3 >> 0x20),(MkvId)pfVar3);
    type = uVar2 + type;
  }
  if (*(long *)(in_RDI + 8) != 0) {
    uVar2 = PrimaryChromaticity::PrimaryChromaticitySize
                      (unaff_retaddr,(MkvId)((ulong)pfVar3 >> 0x20),(MkvId)pfVar3);
    type = uVar2 + type;
  }
  return type;
}

Assistant:

uint64_t MasteringMetadata::PayloadSize() const {
  uint64_t size = 0;

  if (luminance_max_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMax, luminance_max_);
  if (luminance_min_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMin, luminance_min_);

  if (r_) {
    size += r_->PrimaryChromaticitySize(libwebm::kMkvPrimaryRChromaticityX,
                                        libwebm::kMkvPrimaryRChromaticityY);
  }
  if (g_) {
    size += g_->PrimaryChromaticitySize(libwebm::kMkvPrimaryGChromaticityX,
                                        libwebm::kMkvPrimaryGChromaticityY);
  }
  if (b_) {
    size += b_->PrimaryChromaticitySize(libwebm::kMkvPrimaryBChromaticityX,
                                        libwebm::kMkvPrimaryBChromaticityY);
  }
  if (white_point_) {
    size += white_point_->PrimaryChromaticitySize(
        libwebm::kMkvWhitePointChromaticityX,
        libwebm::kMkvWhitePointChromaticityY);
  }

  return size;
}